

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallNormalHeapBucket.cpp
# Opt level: O2

void __thiscall
Memory::SmallNormalHeapBucketBase<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>::
SweepPendingObjects(SmallNormalHeapBucketBase<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>
                    *this,RecyclerSweep *recyclerSweep)

{
  SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *list;
  undefined4 *puVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  Recycler *recycler;
  SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *pSVar5;
  undefined8 *in_FS_OFFSET;
  anon_class_16_2_03c8067a fn;
  
  bVar3 = RecyclerSweep::IsBackground(recyclerSweep);
  HeapBucketT<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>::VerifyHeapBlockCount
            (&this->
              super_HeapBucketT<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>,
             bVar3);
  uVar4 = HeapBucket::GetMediumBucketIndex((HeapBucket *)this);
  list = (recyclerSweep->mediumNormalData).bucketData[uVar4].pendingSweepList;
  recycler = RecyclerSweep::GetRecycler(recyclerSweep);
  if (list != (SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
    bVar3 = recycler->inPartialCollectMode;
    (recyclerSweep->mediumNormalData).bucketData[uVar4].pendingSweepList =
         (SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *)0x0;
    if (bVar3 == true) {
      fn.recycler = recycler;
      fn.this = this;
      HeapBlockList::
      ForEachEditing<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>,Memory::SmallNormalHeapBucketBase<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>>::SweepPendingObjects(Memory::RecyclerSweep&)::_lambda(Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>*)_1_>
                (list,fn);
    }
    else {
      pSVar5 = SweepPendingObjects<(Memory::SweepMode)1>(this,recycler,list);
      (pSVar5->super_SmallHeapBlockT<MediumAllocationBlockAttributes>).next =
           &((this->
             super_HeapBucketT<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>).
            heapBlockList)->super_SmallHeapBlockT<MediumAllocationBlockAttributes>;
      (this->super_HeapBucketT<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>).
      heapBlockList = list;
      HeapBucketT<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>::
      StartAllocationAfterSweep
                (&this->
                  super_HeapBucketT<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>
                );
    }
    bVar3 = RecyclerSweep::IsBackground(recyclerSweep);
    HeapBucketT<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>::
    VerifyHeapBlockCount
              (&this->
                super_HeapBucketT<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>,
               bVar3);
  }
  bVar3 = HeapBucketT<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>::
          IsAllocationStopped(&this->
                               super_HeapBucketT<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>
                             );
  if (bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallNormalHeapBucket.cpp"
                       ,0x137,"(!this->IsAllocationStopped())","!this->IsAllocationStopped()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar1 = 0;
  }
  return;
}

Assistant:

void
SmallNormalHeapBucketBase<TBlockType>::SweepPendingObjects(RecyclerSweep& recyclerSweep)
{
    RECYCLER_SLOW_CHECK(this->VerifyHeapBlockCount(recyclerSweep.IsBackground()));

    CompileAssert(!BaseT::IsLeafBucket);
    TBlockType *& pendingSweepList = recyclerSweep.GetPendingSweepBlockList(this);
    TBlockType * const list = pendingSweepList;
    Recycler * const recycler = recyclerSweep.GetRecycler();
#if ENABLE_PARTIAL_GC
    bool const partialSweep = recycler->inPartialCollectMode;
#endif
    if (list)
    {
        pendingSweepList = nullptr;
#if ENABLE_PARTIAL_GC
        if (partialSweep)
        {
            // We did a partial sweep.
            // Blocks in the pendingSweepList are the ones we decided not to reuse.

            HeapBlockList::ForEachEditing(list, [this, recycler](TBlockType * heapBlock)
            {
                // We are not going to reuse this block.
                // SweepMode_ConcurrentPartial will not actually collect anything, it will just update some state.
                // The sweepable objects will be collected in a future Sweep.

                // Note, page heap blocks are never swept concurrently
#ifdef RECYCLER_TRACE
                recycler->PrintBlockStatus(this, heapBlock, _u("[**17**] calling SweepObjects."));
#endif
                heapBlock->template SweepObjects<SweepMode_ConcurrentPartial>(recycler);

                // page heap mode should never reach here, so don't check pageheap enabled or not
                DebugOnly(this->AssertCheckHeapBlockNotInAnyList(heapBlock));
                if (heapBlock->HasFreeObject())
                {
                    AssertMsg(!HeapBlockList::Contains(heapBlock, partialSweptHeapBlockList), "The heap block already exists in the partialSweptHeapBlockList.");
                    // We have pre-existing free objects, so put this in the partialSweptHeapBlockList
                    heapBlock->SetNextBlock(this->partialSweptHeapBlockList);
                    this->partialSweptHeapBlockList = heapBlock;
#ifdef RECYCLER_TRACE
                    this->GetRecycler()->PrintBlockStatus(this, heapBlock, _u("[**21**] finished SweepPendingObjects, heapblock added to partialSweptHeapBlockList."));
#endif
                }
                else
                {
                    // No free objects, so put in the fullBlockList
                    heapBlock->SetNextBlock(this->fullBlockList);
                    this->fullBlockList = heapBlock;
#ifdef RECYCLER_TRACE
                    this->GetRecycler()->PrintBlockStatus(this, heapBlock, _u("[**22**] finished SweepPendingObjects, heapblock FULL added to fullBlockList."));
#endif
                }
            });
        }
        else
#endif
        {
            // We decided not to do a partial sweep.
            // Blocks in the pendingSweepList need to have a regular sweep.

#if ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP && SUPPORT_WIN32_SLIST
            if (CONFIG_FLAG_RELEASE(EnableConcurrentSweepAlloc))
            {
                if (this->AllowAllocationsDuringConcurrentSweep() && !this->AllocationsStartedDuringConcurrentSweep())
                {
                    Assert(!this->IsAnyFinalizableBucket());
                    this->StartAllocationDuringConcurrentSweep();
                }
            }
#endif

            TBlockType * tail = SweepPendingObjects<SweepMode_Concurrent>(recycler, list);

#if ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP && SUPPORT_WIN32_SLIST
            // During concurrent sweep if allocations were allowed, the heap blocks directly go into the SLIST of
            // allocable heap blocks. They will be returned to the heapBlockList at the end of the sweep.
            if (!this->AllowAllocationsDuringConcurrentSweep())
#endif
            {
                tail->SetNextBlock(this->heapBlockList);
                this->heapBlockList = list;

                this->StartAllocationAfterSweep();
            }
        }

        RECYCLER_SLOW_CHECK(this->VerifyHeapBlockCount(recyclerSweep.IsBackground()));
    }

    Assert(!this->IsAllocationStopped());
}